

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

ostream * operator<<(ostream *os,Result<unsigned_int,_double> *r)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)&r->name);
  poVar1 = std::operator<<(poVar1," - ");
  poVar1 = std::operator<<(poVar1,(string *)&r->description);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Absolute error: (");
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).minimum);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).maximum);
  std::operator<<(poVar1,"), mean: ");
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).mean);
  std::operator<<(poVar1,", median: ");
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).median);
  std::operator<<(poVar1,", variance: ");
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).variance);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Relative error: (");
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).minimum);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).maximum);
  std::operator<<(poVar1,"), mean: ");
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).mean);
  std::operator<<(poVar1,", median: ");
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).median);
  std::operator<<(poVar1,", variance: ");
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).variance);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Standard deviation: ");
  poVar1 = std::ostream::_M_insert<double>(r->stddev);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"Execution time: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(float)(r->callNs - r->overheadNs) / (float)r->samplesInRange);
  poVar1 = std::operator<<(poVar1," ns / call");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Result<InputT, StorageT>& r)
{
    os << r.name << " - " << r.description << std::endl;
    auto& ae = r.absoluteErrors;
    os << "Absolute error: (" << ae.minimum << ", " << ae.maximum << "), mean: " << ae.mean << ", median: " << ae.median << ", variance: " << ae.variance << std::endl;
    auto& re = r.relativeErrors;
    os << "Relative error: (" << re.minimum << ", " << re.maximum << "), mean: " << re.mean << ", median: " << re.median << ", variance: " << re.variance << std::endl;
    os << "Standard deviation: " << r.stddev << std::endl;
    os << "Execution time: " << float(r.callNs - r.overheadNs) / float(r.samplesInRange) << " ns / call" << std::endl;
    return os;
}